

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O0

void __thiscall my_form::my_form(my_form *this)

{
  long lVar1;
  form *pfVar2;
  form *in_RDI;
  char *in_stack_fffffffffffff9f8;
  basic_message<char> *in_stack_fffffffffffffa00;
  allocator *paVar3;
  double in_stack_fffffffffffffa08;
  numeric<double> *in_stack_fffffffffffffa10;
  numeric<double> *in_stack_fffffffffffffa40;
  allocator local_469;
  string local_468 [32];
  regex local_448 [15];
  allocator local_439;
  string local_438 [39];
  allocator local_411;
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [39];
  allocator local_3c1;
  string local_3c0 [39];
  allocator local_399;
  string local_398 [39];
  allocator local_371;
  string local_370 [167];
  allocator local_2c9;
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [167];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [167];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [39];
  allocator local_39;
  string local_38 [56];
  
  cppcms::form::form(in_RDI);
  *(undefined ***)in_RDI = &PTR_render_0015a6b8;
  cppcms::widgets::text::text((text *)(in_RDI + 0x30));
  cppcms::widgets::numeric<double>::numeric(in_stack_fffffffffffffa40);
  cppcms::widgets::password::password((password *)(in_RDI + 0x528));
  cppcms::widgets::password::password((password *)(in_RDI + 0x7c0));
  cppcms::widgets::textarea::textarea((textarea *)(in_RDI + 0xa58));
  cppcms::widgets::select_multiple::select_multiple((select_multiple *)(in_RDI + 0xcb0));
  cppcms::widgets::radio::radio((radio *)(in_RDI + 0xee0));
  cppcms::widgets::select::select((select *)(in_RDI + 0x1120));
  cppcms::widgets::file::file((file *)(in_RDI + 0x1358));
  cppcms::widgets::file::file((file *)(in_RDI + 0x15f8));
  cppcms::widgets::hidden::hidden((hidden *)(in_RDI + 0x1898));
  lVar1 = *(long *)(*(long *)(in_RDI + 0x30) + -0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Your Name",&local_39);
  cppcms::widgets::base_widget::message(in_RDI + lVar1 + 0x30,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  cppcms::widgets::base_text::limits((int)in_RDI + 0x60,2);
  lVar1 = *(long *)(*(long *)(in_RDI + 0x2b8) + -0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Your Age",&local_61);
  cppcms::widgets::base_widget::message(in_RDI + lVar1 + 0x2b8,local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  cppcms::widgets::numeric<double>::range
            (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,(double)in_stack_fffffffffffffa00);
  lVar1 = *(long *)(*(long *)(in_RDI + 0xa58) + -0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Describe Yourself",&local_89);
  cppcms::widgets::base_widget::message(in_RDI + lVar1 + 0xa58,local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  lVar1 = *(long *)(*(long *)(in_RDI + 0x528) + -0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Password",&local_b1);
  cppcms::widgets::base_widget::message(in_RDI + lVar1 + 0x528,local_b0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  lVar1 = *(long *)(*(long *)(in_RDI + 0x7c0) + -0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"Confirm",&local_d9);
  cppcms::widgets::base_widget::message(in_RDI + lVar1 + 0x7c0,local_d8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  cppcms::widgets::password::check_equal((password *)(in_RDI + 0x528));
  cppcms::widgets::base_text::non_empty();
  booster::locale::translate<char>(in_stack_fffffffffffff9f8);
  cppcms::widgets::base_widget::message((basic_message *)(in_RDI + 0xcb0));
  booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffffa00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"Foo",&local_181);
  cppcms::widgets::select_multiple::add((string *)(in_RDI + 0xcb0),SUB81(local_180,0));
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"Bar",&local_1a9);
  cppcms::widgets::select_multiple::add((string *)(in_RDI + 0xcb0),SUB81(local_1a8,0));
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"Bee",&local_1d1);
  cppcms::widgets::select_multiple::add((string *)(in_RDI + 0xcb0),SUB81(local_1d0,0));
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"Car",&local_1f9);
  cppcms::widgets::select_multiple::add((string *)(in_RDI + 0xcb0),SUB81(local_1f8,0));
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  booster::locale::translate<char>(in_stack_fffffffffffff9f8);
  cppcms::widgets::base_widget::message((basic_message *)(in_RDI + 0xee0));
  booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffffa00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"Apple",&local_2a1);
  cppcms::widgets::select_base::add((string *)(in_RDI + 0xee0));
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"Orange",&local_2c9);
  cppcms::widgets::select_base::add((string *)(in_RDI + 0xee0));
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  booster::locale::translate<char>(in_stack_fffffffffffff9f8);
  cppcms::widgets::base_widget::message((basic_message *)(in_RDI + 0x1120));
  booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffffa00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"Male",&local_371);
  cppcms::widgets::select_base::add((string *)(in_RDI + 0x1120));
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"Femail",&local_399);
  cppcms::widgets::select_base::add((string *)(in_RDI + 0x1120));
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  paVar3 = &local_3c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"You are sexist",paVar3);
  cppcms::widgets::select_base::add((string *)(in_RDI + 0x1120));
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  cppcms::widgets::select_multiple::at_least((int)in_RDI + 0xcb0);
  cppcms::widgets::select_base::non_empty();
  cppcms::widgets::file::non_empty();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e8,"GIF89a",&local_3e9);
  cppcms::widgets::file::add_valid_magic((string *)(in_RDI + 0x1358));
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_410,"GIF87a",&local_411);
  cppcms::widgets::file::add_valid_magic((string *)(in_RDI + 0x1358));
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  pfVar2 = in_RDI + 0x1358;
  paVar3 = &local_439;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_438,anon_var_dwarf_e174,paVar3);
  cppcms::widgets::file::add_valid_magic((string *)pfVar2);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  pfVar2 = in_RDI + 0x15f8;
  paVar3 = &local_469;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_468,"text/.*",paVar3);
  booster::regex::regex(local_448,local_468,0);
  cppcms::widgets::file::mime((regex *)pfVar2);
  booster::regex::~regex(local_448);
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  cppcms::form::add((base_widget *)in_RDI);
  cppcms::form::add((base_widget *)in_RDI);
  cppcms::form::add((base_widget *)in_RDI);
  cppcms::form::add((base_widget *)in_RDI);
  cppcms::form::add((base_widget *)in_RDI);
  cppcms::form::add((base_widget *)in_RDI);
  cppcms::form::add((base_widget *)in_RDI);
  cppcms::form::add((base_widget *)in_RDI);
  cppcms::form::add((base_widget *)in_RDI);
  cppcms::form::add((base_widget *)in_RDI);
  cppcms::form::add((base_widget *)in_RDI);
  return;
}

Assistant:

my_form()
	{
		name.message("Your Name");
		name.limits(2,30);
		age.message("Your Age");
		age.range(0,120);
		description.message("Describe Yourself");
		p1.message("Password");
		p2.message("Confirm");
		p1.check_equal(p2);
		p1.non_empty();
		sel.message(cppcms::locale::translate("Files:"));
		sel.add("Foo");
		sel.add("Bar");
		sel.add("Bee");
		sel.add("Car");
		sel1.message(cppcms::locale::translate("Fruit"));
		sel1.add("Apple");
		sel1.add("Orange");
		sel2.message(cppcms::locale::translate("Sex"));
		sel2.add("Male");
		sel2.add("Femail");
		sel2.add("You are sexist");
		sel.at_least(2);
		sel1.non_empty();
		gif.non_empty();
		gif.add_valid_magic("GIF89a");
		gif.add_valid_magic("GIF87a");
		gif.add_valid_magic("\x89PNG\r\n\x1a\n");
		text.mime(booster::regex("text/.*"));
		add(name);
		add(age);
		add(p1);
		add(p2);
		add(description);
		add(sel);
		add(sel1);
		add(sel2);
		add(gif);
		add(text);
		add(secret);
	}